

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringCache.h
# Opt level: O2

JavascriptString * __thiscall
Js::StringCache::InitializeString<true,8ul>(StringCache *this,char16 (*value) [8])

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertyString *pPVar4;
  int propertyId;
  PropertyRecord *local_20;
  PropertyRecord *propertyRecord;
  
  local_20 = (PropertyRecord *)0x0;
  ScriptContext::FindPropertyRecord((this->scriptContext).ptr,*value,7,&local_20);
  if (local_20 == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/StringCache.h"
                                ,0x43,"(propertyRecord != nullptr)",
                                "Trying to create a propertystring for non property string?");
    if (!bVar2) goto LAB_00394760;
    *puVar3 = 0;
  }
  propertyId = local_20->pid;
  if (0x2d8 < propertyId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/StringCache.h"
                                ,0x44,"(IsBuiltInPropertyId(propertyRecord->GetPropertyId()))",
                                "IsBuiltInPropertyId(propertyRecord->GetPropertyId())");
    if (!bVar2) {
LAB_00394760:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    propertyId = local_20->pid;
  }
  pPVar4 = ScriptContext::GetPropertyString((this->scriptContext).ptr,propertyId);
  return &pPVar4->super_JavascriptString;
}

Assistant:

JavascriptString* InitializeString(const char16(&value)[N]) const
    {
        if (withPropertyString)
        {
            const PropertyRecord* propertyRecord = nullptr;
            scriptContext->FindPropertyRecord(value, N - 1, &propertyRecord);
            AssertMsg(propertyRecord != nullptr, "Trying to create a propertystring for non property string?");
            Assert(IsBuiltInPropertyId(propertyRecord->GetPropertyId()));
            return scriptContext->GetPropertyString(propertyRecord->GetPropertyId());
        }
        else
        {
            return LiteralString::New(stringTypeStatic, value, N - 1 /*don't include terminating NUL*/, scriptContext->GetRecycler());
        }
    }